

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_rb_commit_read(ma_rb *pRB,size_t sizeInBytes,void *pBufferOut)

{
  uint local_74;
  uint local_70;
  ma_uint32 newReadOffsetLoopFlag;
  ma_uint32 newReadOffsetInBytes;
  ma_uint32 readOffsetLoopFlag;
  ma_uint32 readOffsetInBytes;
  ma_uint32 readOffset;
  void *pBufferOut_local;
  size_t sizeInBytes_local;
  ma_rb *pRB_local;
  ma_uint32 *local_40;
  ma_uint32 *local_38;
  uint local_30;
  uint local_2c;
  ma_rb *local_28;
  uint local_14;
  
  if (pRB == (ma_rb *)0x0) {
    pRB_local._4_4_ = -2;
  }
  else {
    _readOffsetInBytes = pBufferOut;
    pBufferOut_local = (void *)sizeInBytes;
    sizeInBytes_local = (size_t)pRB;
    local_28 = pRB;
    if (pRB == (ma_rb *)0x0) {
      __assert_fail("pRB != __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/mackron/miniaudio.h"
                    ,0xa50a,"void *ma_rb__get_read_ptr(ma_rb *)");
    }
    local_2c = pRB->encodedReadOffset;
    if (pBufferOut == (void *)((long)pRB->pBuffer + (ulong)(local_2c & 0x7fffffff))) {
      readOffsetLoopFlag = pRB->encodedReadOffset;
      local_38 = &newReadOffsetInBytes;
      local_40 = &newReadOffsetLoopFlag;
      local_30 = readOffsetLoopFlag;
      local_14 = local_2c;
      if (local_38 == (ma_uint32 *)0x0) {
        __assert_fail("pOffsetInBytes != __null",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/mackron/miniaudio.h"
                      ,0xa51b,"void ma_rb__deconstruct_offset(ma_uint32, ma_uint32 *, ma_uint32 *)")
        ;
      }
      if (local_40 == (ma_uint32 *)0x0) {
        __assert_fail("pOffsetLoopFlag != __null",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/mackron/miniaudio.h"
                      ,0xa51c,"void ma_rb__deconstruct_offset(ma_uint32, ma_uint32 *, ma_uint32 *)")
        ;
      }
      pBufferOut_local._0_4_ = (int)sizeInBytes;
      local_74 = readOffsetLoopFlag & 0x80000000;
      local_70 = (readOffsetLoopFlag & 0x7fffffff) + (int)pBufferOut_local;
      if (pRB->subbufferSizeInBytes < local_70) {
        pRB_local._4_4_ = -2;
      }
      else {
        if (local_70 == pRB->subbufferSizeInBytes) {
          local_70 = 0;
          local_74 = local_74 ^ 0x80000000;
        }
        LOCK();
        pRB->encodedReadOffset = local_70 | local_74;
        UNLOCK();
        pRB_local._4_4_ = 0;
      }
    }
    else {
      pRB_local._4_4_ = -2;
    }
  }
  return pRB_local._4_4_;
}

Assistant:

MA_API ma_result ma_rb_commit_read(ma_rb* pRB, size_t sizeInBytes, void* pBufferOut)
{
    ma_uint32 readOffset;
    ma_uint32 readOffsetInBytes;
    ma_uint32 readOffsetLoopFlag;
    ma_uint32 newReadOffsetInBytes;
    ma_uint32 newReadOffsetLoopFlag;

    if (pRB == NULL) {
        return MA_INVALID_ARGS;
    }

    /* Validate the buffer. */
    if (pBufferOut != ma_rb__get_read_ptr(pRB)) {
        return MA_INVALID_ARGS;
    }

    readOffset = c89atomic_load_32(&pRB->encodedReadOffset);
    ma_rb__deconstruct_offset(readOffset, &readOffsetInBytes, &readOffsetLoopFlag);

    /* Check that sizeInBytes is correct. It should never go beyond the end of the buffer. */
    newReadOffsetInBytes = (ma_uint32)(readOffsetInBytes + sizeInBytes);
    if (newReadOffsetInBytes > pRB->subbufferSizeInBytes) {
        return MA_INVALID_ARGS;    /* <-- sizeInBytes will cause the read offset to overflow. */
    }

    /* Move the read pointer back to the start if necessary. */
    newReadOffsetLoopFlag = readOffsetLoopFlag;
    if (newReadOffsetInBytes == pRB->subbufferSizeInBytes) {
        newReadOffsetInBytes = 0;
        newReadOffsetLoopFlag ^= 0x80000000;
    }

    c89atomic_exchange_32(&pRB->encodedReadOffset, ma_rb__construct_offset(newReadOffsetLoopFlag, newReadOffsetInBytes));
    return MA_SUCCESS;
}